

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

void __thiscall
spvtools::val::ValidationState_t::RegisterDebugInstruction
          (ValidationState_t *this,Instruction *inst)

{
  undefined4 uVar1;
  Op OVar2;
  string local_a8;
  undefined1 local_88 [8];
  string str_1;
  undefined1 local_60 [4];
  uint target_1;
  undefined1 local_40 [8];
  string str;
  uint target;
  Instruction *inst_local;
  ValidationState_t *this_local;
  
  OVar2 = val::Instruction::opcode(inst);
  if (2 < OVar2 - OpSourceContinued) {
    if (OVar2 == OpName) {
      str.field_2._12_4_ = val::Instruction::GetOperandAs<unsigned_int>(inst,0);
      val::Instruction::GetOperandAs<std::__cxx11::string>((string *)local_40,inst,1);
      uVar1 = str.field_2._12_4_;
      std::__cxx11::string::string((string *)local_60,(string *)local_40);
      AssignNameToId(this,uVar1,(string *)local_60);
      std::__cxx11::string::~string((string *)local_60);
      std::__cxx11::string::~string((string *)local_40);
    }
    else if (OVar2 == OpMemberName) {
      str_1.field_2._12_4_ = val::Instruction::GetOperandAs<unsigned_int>(inst,0);
      val::Instruction::GetOperandAs<std::__cxx11::string>((string *)local_88,inst,2);
      uVar1 = str_1.field_2._12_4_;
      std::__cxx11::string::string((string *)&local_a8,(string *)local_88);
      AssignNameToId(this,uVar1,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)local_88);
    }
  }
  return;
}

Assistant:

void ValidationState_t::RegisterDebugInstruction(const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpName: {
      const auto target = inst->GetOperandAs<uint32_t>(0);
      const std::string str = inst->GetOperandAs<std::string>(1);
      AssignNameToId(target, str);
      break;
    }
    case spv::Op::OpMemberName: {
      const auto target = inst->GetOperandAs<uint32_t>(0);
      const std::string str = inst->GetOperandAs<std::string>(2);
      AssignNameToId(target, str);
      break;
    }
    case spv::Op::OpSourceContinued:
    case spv::Op::OpSource:
    case spv::Op::OpSourceExtension:
    case spv::Op::OpString:
    case spv::Op::OpLine:
    case spv::Op::OpNoLine:
    default:
      break;
  }
}